

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O0

pair<const_llvm::ConstantInt_*,_dg::vr::Relations> __thiscall
dg::vr::ValueRelations::getBound(ValueRelations *this,Handle h,Relations rels)

{
  bool bVar1;
  reference ppVar2;
  _Base_bitset<1UL> rels_00;
  RelationsGraph<dg::vr::ValueRelations> *in_RDX;
  Relations *in_RSI;
  Bucket *in_RDI;
  C c;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> *pair;
  iterator __end2;
  iterator __begin2;
  RelationsMap *__range2;
  Relations resultR;
  C resultC;
  RelationsMap related;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffff58;
  _Self local_80;
  _Self local_78;
  Handle h_00;
  _Base_bitset<1UL> in_stack_ffffffffffffff98;
  ConstantInt *local_60;
  undefined1 local_58 [47];
  bool in_stack_ffffffffffffffd7;
  pair<const_llvm::ConstantInt_*,_dg::vr::Relations> local_10;
  
  RelationsGraph<dg::vr::ValueRelations>::getRelated(in_RDX,in_RDI,in_RSI,in_stack_ffffffffffffffd7)
  ;
  local_60 = (ConstantInt *)0x0;
  Relations::Relations((Relations *)0x208a1c);
  h_00 = (Handle)local_58;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::end(in_stack_ffffffffffffff58);
  while (bVar1 = std::operator!=(&local_78,&local_80), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                          *)0x208a66);
    std::reference_wrapper::operator_cast_to_Bucket_
              ((reference_wrapper<const_dg::vr::Bucket> *)0x208a75);
    rels_00._M_w = (_WordT)getAnyConst(in_stack_ffffffffffffff98._M_w,h_00);
    if (((_Base_bitset<1UL>)rels_00._M_w != (_Base_bitset<1UL>)0x0) &&
       ((local_60 == (ConstantInt *)0x0 ||
        (bVar1 = compare((C)in_RDX,(Relations)rels_00._M_w,(C)in_RDI), bVar1)))) {
      in_stack_ffffffffffffff98._M_w = (ppVar2->second).bits.super__Base_bitset<1UL>._M_w;
      local_60 = (ConstantInt *)rels_00._M_w;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)in_RDI);
  }
  std::pair<const_llvm::ConstantInt_*,_dg::vr::Relations>::
  pair<const_llvm::ConstantInt_*&,_dg::vr::Relations_&,_true>
            (&local_10,&local_60,(Relations *)&stack0xffffffffffffff98);
  std::
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)0x208b08);
  return local_10;
}

Assistant:

std::pair<ValueRelations::C, Relations>
ValueRelations::getBound(Handle h, Relations rels) const {
    RelationsMap related = graph.getRelated(h, rels);

    C resultC = nullptr;
    Relations resultR;
    for (const auto &pair : related) {
        C c = getAnyConst(pair.first);
        if (c && (!resultC || compare(c, rels, resultC))) {
            resultC = c;
            resultR = pair.second;
        }
    }

    return {resultC, resultR};
}